

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::BrickGravity::Evaluate
          (BrickGravity *this,ChVectorN<double,_8> *result,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ChElementHexaANCF_3813 *pCVar14;
  ChMatrixNM<double,_8,_3> *pCVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  ActualDstType actualDst;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  
  dVar37 = x;
  ChElementHexaANCF_3813::ShapeFunctions((ChElementHexaANCF_3813 *)this,&this->N,x,y,z);
  dVar38 = y;
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeX(this->element,&this->Nx,dVar37,y,z);
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeY(this->element,&this->Ny,x,dVar38,z);
  pCVar14 = this->element;
  pCVar15 = this->d0;
  dVar16 = (2.0 / (pCVar14->m_InertFlexVec).m_data[2]) * 0.125;
  dVar17 = (1.0 - x) * dVar16;
  dVar18 = (1.0 - y) * dVar17;
  auVar34._8_8_ = 0x8000000000000000;
  auVar34._0_8_ = 0x8000000000000000;
  auVar52._8_8_ = dVar18;
  auVar52._0_8_ = dVar18;
  auVar28._0_8_ = -dVar18;
  auVar28._8_8_ = -dVar18;
  dVar16 = (x + 1.0) * dVar16;
  dVar19 = dVar16 * (y + 1.0);
  auVar48._8_8_ = dVar19;
  auVar48._0_8_ = dVar19;
  auVar45._0_8_ = -dVar19;
  auVar45._8_8_ = -dVar19;
  dVar17 = (y + 1.0) * dVar17;
  auVar42._8_8_ = dVar17;
  auVar42._0_8_ = dVar17;
  auVar39._0_8_ = -dVar17;
  auVar39._8_8_ = -dVar17;
  auVar35 = vunpcklpd_avx(auVar45,auVar39);
  *(undefined1 (*) [16])
   ((this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array +
   2) = auVar35;
  dVar16 = dVar16 * (1.0 - y);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar16;
  auVar20 = vmovddup_avx512vl(auVar35);
  auVar21 = vxorpd_avx512vl(auVar20,auVar34);
  auVar35 = vunpcklpd_avx(auVar28,auVar21);
  *(undefined1 (*) [16])
   (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array =
       auVar35;
  (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[4]
       = dVar18;
  (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5]
       = dVar16;
  (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[6]
       = dVar19;
  (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7]
       = dVar17;
  auVar35 = *(undefined1 (*) [16])
             ((pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0x15);
  auVar34 = *(undefined1 (*) [16])
             ((pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0x12);
  auVar33 = *(undefined1 (*) [16])
             ((pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0xf);
  auVar32 = *(undefined1 (*) [16])
             ((pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0xc);
  auVar31 = *(undefined1 (*) [16])
             ((pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 9);
  auVar30 = *(undefined1 (*) [16])
             ((pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 6);
  auVar29 = *(undefined1 (*) [16])
             ((pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 3);
  auVar28 = *(undefined1 (*) [16])
             (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
             m_data.array;
  dVar38 = (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
           array[2];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar38;
  dVar37 = (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
           array[5];
  dVar1 = (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
          array[8];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar1;
  dVar2 = (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
          array[0xb];
  dVar3 = (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
          array[0xe];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar3;
  dVar4 = (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
          array[0x11];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar4;
  dVar5 = (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
          array[0x14];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar5;
  dVar6 = (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
          array[0x17];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar6;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar22 = vmovddup_avx512vl(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar23 = vmovddup_avx512vl(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar24 = vmovddup_avx512vl(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar25 = vmovddup_avx512vl(auVar25);
  auVar26 = vmulpd_avx512vl(auVar28,auVar25);
  auVar27 = vfmadd231pd_avx512vl(auVar26,auVar29,auVar24);
  auVar25 = vmulsd_avx512f(auVar51,auVar25);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar37;
  auVar24 = vmulsd_avx512f(auVar57,auVar24);
  auVar24 = vaddsd_avx512f(auVar24,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar25 = vmovddup_avx512vl(auVar26);
  auVar26 = vfmadd231pd_avx512vl(auVar27,auVar30,auVar25);
  auVar26 = vfmadd231pd_avx512vl(auVar26,auVar31,auVar23);
  auVar25 = vmulsd_avx512f(auVar50,auVar25);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar2;
  auVar23 = vmulsd_avx512f(auVar55,auVar23);
  auVar23 = vaddsd_avx512f(auVar23,auVar25);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar25 = vmovddup_avx512vl(auVar27);
  auVar23 = vaddsd_avx512f(auVar23,auVar24);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar24 = vmovddup_avx512vl(auVar10);
  auVar26 = vfmadd231pd_avx512vl(auVar26,auVar32,auVar24);
  auVar26 = vfmadd231pd_avx512vl(auVar26,auVar33,auVar25);
  auVar24 = vmulsd_avx512f(auVar46,auVar24);
  auVar25 = vmulsd_avx512f(auVar47,auVar25);
  auVar24 = vaddsd_avx512f(auVar25,auVar24);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar25 = vmovddup_avx512vl(auVar11);
  auVar26 = vfmadd231pd_avx512vl(auVar26,auVar34,auVar25);
  auVar26 = vfmadd231pd_avx512vl(auVar26,auVar35,auVar22);
  auVar25 = vmulsd_avx512f(auVar40,auVar25);
  auVar22 = vmulsd_avx512f(auVar41,auVar22);
  auVar22 = vaddsd_avx512f(auVar22,auVar25);
  auVar22 = vaddsd_avx512f(auVar22,auVar24);
  auVar22 = vaddsd_avx512f(auVar22,auVar23);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar23 = vmovddup_avx512vl(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar24 = vmovddup_avx512vl(auVar13);
  auVar25 = vmulpd_avx512vl(auVar28,auVar24);
  auVar25 = vfmadd231pd_avx512vl(auVar25,auVar29,auVar23);
  auVar28 = vmulpd_avx512vl(auVar52,auVar28);
  auVar28 = vfnmsub231pd_avx512vl(auVar28,auVar20,auVar29);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar29 = vmovddup_avx512vl(auVar29);
  auVar25 = vfmadd231pd_avx512vl(auVar25,auVar30,auVar29);
  auVar28 = vfnmadd231pd_avx512vl(auVar28,auVar48,auVar30);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar30 = vmovddup_avx512vl(auVar30);
  auVar25 = vfmadd231pd_avx512vl(auVar25,auVar31,auVar30);
  auVar31 = vfnmadd231pd_avx512vl(auVar28,auVar42,auVar31);
  auVar31 = vfmadd231pd_avx512vl(auVar31,auVar32,auVar52);
  dVar7 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
          array[4];
  auVar53._8_8_ = dVar7;
  auVar53._0_8_ = dVar7;
  auVar28 = vfmadd231pd_avx512vl(auVar25,auVar32,auVar53);
  auVar31 = vfmadd231pd_avx512vl(auVar31,auVar33,auVar20);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar32 = vmovddup_avx512vl(auVar32);
  auVar33 = vfmadd231pd_avx512vl(auVar28,auVar33,auVar32);
  auVar31 = vfmadd231pd_avx512vl(auVar31,auVar34,auVar48);
  dVar8 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
          array[6];
  auVar49._8_8_ = dVar8;
  auVar49._0_8_ = dVar8;
  auVar34 = vfmadd231pd_avx512vl(auVar33,auVar34,auVar49);
  auVar31 = vfmadd231pd_avx512vl(auVar31,auVar35,auVar42);
  dVar9 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
          array[7];
  auVar43._8_8_ = dVar9;
  auVar43._0_8_ = dVar9;
  auVar28 = vfmadd231pd_avx512vl(auVar34,auVar35,auVar43);
  auVar35 = vmulsd_avx512f(auVar24,auVar51);
  auVar34 = vmulsd_avx512f(auVar23,auVar57);
  auVar35 = vaddsd_avx512f(auVar35,auVar34);
  auVar34 = vmulsd_avx512f(auVar29,auVar50);
  auVar33 = vmulsd_avx512f(auVar30,auVar55);
  auVar34 = vaddsd_avx512f(auVar34,auVar33);
  auVar35 = vaddsd_avx512f(auVar35,auVar34);
  auVar34 = vmulsd_avx512f(auVar32,auVar47);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar7 * dVar3;
  auVar34 = vaddsd_avx512f(auVar54,auVar34);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auVar34._0_8_ + dVar8 * dVar5 + dVar9 * dVar6;
  auVar32 = vaddsd_avx512f(auVar35,auVar44);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar37;
  auVar34 = vmulsd_avx512f(auVar58,auVar21);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar2;
  auVar33 = vmulsd_avx512f(auVar56,auVar39);
  auVar35 = vshufpd_avx(auVar26,auVar26,1);
  auVar30 = vshufpd_avx512vl(auVar28,auVar28,1);
  auVar29 = vshufpd_avx512vl(auVar31,auVar31,1);
  auVar23 = vmulsd_avx512f(auVar22,auVar29);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (auVar34._0_8_ - dVar38 * dVar18) + (auVar33._0_8_ - dVar1 * dVar19) +
       dVar3 * dVar18 + dVar4 * dVar16 + dVar19 * dVar5 + dVar6 * dVar17;
  auVar34 = vfmsub231sd_fma(auVar23,auVar35,auVar20);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar32._0_8_ * auVar29._0_8_;
  auVar33 = vfmsub231sd_fma(auVar33,auVar30,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar32._0_8_ * auVar35._0_8_;
  auVar35 = vfmsub231sd_avx512f(auVar21,auVar30,auVar22);
  auVar34 = vmulsd_avx512f(auVar28,auVar34);
  auVar35 = vmulsd_avx512f(auVar31,auVar35);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (pCVar14->m_InertFlexVec).m_data[2] * 0.5 *
       (pCVar14->m_InertFlexVec).m_data[1] * 0.5 *
       (pCVar14->m_InertFlexVec).m_data[0] * 0.5 *
       (auVar35._0_8_ + (auVar34._0_8_ - auVar33._0_8_ * auVar26._0_8_));
  auVar36 = vbroadcastsd_avx512f(auVar31);
  auVar36 = vmulpd_avx512f(auVar36,*(undefined1 (*) [64])
                                    (this->N).
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                                    m_storage.m_data.array);
  *(undefined1 (*) [64])
   (result->super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>).m_storage.m_data.array =
       auVar36;
  return;
}

Assistant:

void BrickGravity::Evaluate(ChVectorN<double, 8>& result, const double x, const double y, const double z) {
    element->ShapeFunctions(N, x, y, z);
    element->ShapeFunctionsDerivativeX(Nx, x, y, z);
    element->ShapeFunctionsDerivativeY(Ny, x, y, z);
    element->ShapeFunctionsDerivativeZ(Nz, x, y, z);

    // Weights for Gaussian integration
    double wx2 = (element->GetLengthX()) / 2;
    double wy2 = (element->GetLengthY()) / 2;
    double wz2 = (element->GetLengthZ()) / 2;

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = (*d0).transpose() * Nx.transpose();
    rd0.col(1) = (*d0).transpose() * Ny.transpose();
    rd0.col(2) = (*d0).transpose() * Nz.transpose();
    double detJ0 = rd0.determinant();

    result = detJ0 * wx2 * wy2 * wz2 * N.transpose();
}